

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O1

void canvas_undo_undo(_glist *x)

{
  t_undo_type tVar1;
  _undo_action *p_Var2;
  char *redo_action;
  int oldstate;
  int iVar3;
  _undo *p_Var4;
  char *pcVar5;
  
  p_Var4 = canvas_undo_get(x);
  if (p_Var4 == (_undo *)0x0) {
    return;
  }
  oldstate = canvas_suspend_dsp();
  if ((p_Var4->u_queue == (_undo_action *)0x0) || (p_Var4->u_last == p_Var4->u_queue))
  goto LAB_00166274;
  p_Var4->u_doing = 1;
  canvas_editmode(x,1.0);
  glist_noselect(x);
  canvas_undo_set_name(p_Var4->u_last->name);
  if (p_Var4->u_last->type == UNDO_SEQUENCE_END) {
    iVar3 = 1;
    do {
      p_Var2 = p_Var4->u_last->prev;
      p_Var4->u_last = p_Var2;
      if (p_Var2 == (_undo_action *)0x0) break;
      tVar1 = p_Var2->type;
      if (tVar1 == UNDO_SEQUENCE_START) {
        iVar3 = iVar3 + -1;
      }
      else if (tVar1 == UNDO_SEQUENCE_END) {
        iVar3 = iVar3 + 1;
      }
      else {
        if (tVar1 == UNDO_INIT) break;
        canvas_undo_doit(x,p_Var2,1,"canvas_undo_undo");
      }
    } while (0 < iVar3);
    if (iVar3 < 0) {
      pcVar5 = "undo sequence missing end";
    }
    else {
      if (iVar3 == 0) goto LAB_00166219;
      pcVar5 = "undo sequence missing start";
    }
    bug(pcVar5);
  }
LAB_00166219:
  iVar3 = canvas_undo_doit(x,p_Var4->u_last,1,"canvas_undo_undo");
  if (iVar3 != 0) {
    p_Var2 = p_Var4->u_last->prev;
    p_Var4->u_last = p_Var2;
    pcVar5 = p_Var2->name;
    redo_action = p_Var2->next->name;
    p_Var4->u_doing = 0;
    canvas_show_undomenu(x,pcVar5,redo_action);
    iVar3 = canvas_undo_isdirty(x);
    canvas_dirty(x,(float)iVar3);
  }
LAB_00166274:
  canvas_resume_dsp(oldstate);
  return;
}

Assistant:

void canvas_undo_undo(t_canvas *x)
{
    t_undo *udo = canvas_undo_get(x);
    int dspwas;

    if (!udo) return;
    dspwas = canvas_suspend_dsp();
    DEBUG_UNDO(post("%s: %p != %p", __FUNCTION__, udo->u_queue, udo->u_last));
    if (udo->u_queue && udo->u_last != udo->u_queue)
    {
        udo->u_doing = 1;
        canvas_editmode(x, 1);
        glist_noselect(x);
        canvas_undo_set_name(udo->u_last->name);

        if(UNDO_SEQUENCE_END == udo->u_last->type)
        {
            int sequence_depth = 1;
            while((udo->u_last = udo->u_last->prev)
                  && (UNDO_INIT != udo->u_last->type))
            {
                DEBUG_UNDO(post("%s:sequence[%d] %d", __FUNCTION__, sequence_depth, udo->u_last->type));
                switch(udo->u_last->type)
                {
                case UNDO_SEQUENCE_START:
                    sequence_depth--;
                    break;
                case UNDO_SEQUENCE_END:
                    sequence_depth++;
                    break;
                default:
                    canvas_undo_doit(x, udo->u_last, UNDO_UNDO, __FUNCTION__);
                }
                if (sequence_depth < 1)
                    break;
            }
            if (sequence_depth < 0)
                bug("undo sequence missing end");
            else if (sequence_depth > 0)
                bug("undo sequence missing start");
        }

        if(canvas_undo_doit(x, udo->u_last, UNDO_UNDO, __FUNCTION__))
        {
            char *undo_action, *redo_action;
            udo->u_last = udo->u_last->prev;
            undo_action = udo->u_last->name;
            redo_action = udo->u_last->next->name;

            udo->u_doing = 0;
                /* here we call updating of all unpaired hubs and nodes since
                   their regular call will fail in case their position needed
                   to be updated by undo/redo first to reflect the old one */
            canvas_show_undomenu(x, undo_action, redo_action);
            canvas_dirty(x, canvas_undo_isdirty(x));
        }
    }
    canvas_resume_dsp(dspwas);
}